

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all.hpp
# Opt level: O2

void __thiscall
timertt::details::
thread_impl_template<timertt::details::timer_wheel_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>
::join(thread_impl_template<timertt::details::timer_wheel_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>
       *this)

{
  shared_ptr<std::thread> *this_00;
  shared_ptr<std::thread> t;
  lock_guard locker;
  __shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2> local_38;
  unique_lock<std::mutex> local_28;
  
  local_38._M_ptr = (element_type *)0x0;
  local_38._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::unique_lock<std::mutex>::unique_lock(&local_28,(mutex_type *)this);
  this_00 = &(this->
             super_basic_methods_impl_mixin<timertt::details::timer_wheel_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>,_timertt::details::consumer_type::thread>
             ).super_type.m_thread;
  std::__shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_38,&this_00->super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>);
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  if (local_38._M_ptr != (element_type *)0x0) {
    std::thread::join();
    std::unique_lock<std::mutex>::unique_lock(&local_28,(mutex_type *)this);
    std::__shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>::reset
              (&this_00->super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>);
    std::unique_lock<std::mutex>::~unique_lock(&local_28);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  return;
}

Assistant:

void
	join()
	{
		std::shared_ptr< std::thread > t;
		{
			typename base_type::lock_guard locker{ *this };
			t = this->m_thread;
		}
		if( t )
		{
			t->join();

			typename base_type::lock_guard locker{ *this };
			this->m_thread.reset();
		}
	}